

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateEnd(zng_stream *strm)

{
  int iVar1;
  zng_stream *in_RDI;
  int32_t status;
  int32_t local_4;
  
  iVar1 = deflateStateCheck(in_RDI);
  if (iVar1 == 0) {
    iVar1 = in_RDI->state->status;
    free_deflate(in_RDI);
    local_4 = 0;
    if (iVar1 == 2) {
      local_4 = -3;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateEnd)(PREFIX3(stream) *strm) {
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;

    int32_t status = strm->state->status;

    /* Free allocated buffers */
    free_deflate(strm);

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}